

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

HighsDebugStatus __thiscall HEkk::debugComputeDual(HEkk *this,bool initialise)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  double *pdVar5;
  const_reference pvVar6;
  reference pvVar7;
  byte in_SIL;
  long in_RDI;
  double dVar8;
  bool sign_change;
  double delta;
  HighsInt iVar_1;
  double zero_delta_dual;
  double value_1;
  HighsInt iVar;
  double norm_nonbasic_costs;
  HighsInt num_delta_dual_values;
  HighsInt num_dual_sign_change;
  HighsInt num_tot;
  vector<double,_std::allocator<double>_> delta_dual;
  vector<double,_std::allocator<double>_> new_dual;
  double value;
  HighsInt iRow;
  double norm_basic_costs;
  SimplexBasis *basis;
  HighsLp *lp;
  HighsOptions *options;
  HighsSimplexInfo *info;
  string *in_stack_00000228;
  undefined1 in_stack_00000237;
  vector<double,_std::allocator<double>_> *in_stack_00000238;
  HighsInt in_stack_00000244;
  string *in_stack_00000248;
  HighsLogOptions *in_stack_00000250;
  size_type in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  bool local_199;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe78;
  value_type vVar9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe80;
  allocator local_149;
  string local_148 [16];
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  allocator local_121;
  string local_120 [39];
  bool local_f9;
  double local_f8;
  int local_ec;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_bc;
  double local_b8;
  int local_ac;
  uint local_a8;
  undefined8 local_98;
  int local_8c;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  vector<int,_std::allocator<int>_> *local_38;
  int *local_30;
  long local_28;
  vector<double,_std::allocator<double>_> *local_20;
  byte local_11;
  HighsDebugStatus local_4;
  
  local_11 = in_SIL & 1;
  if ((debugComputeDual(bool)::previous_dual == '\0') &&
     (iVar1 = __cxa_guard_acquire(&debugComputeDual(bool)::previous_dual), iVar1 != 0)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x7836c1);
    __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,
                 &debugComputeDual::previous_dual,&__dso_handle);
    __cxa_guard_release(&debugComputeDual(bool)::previous_dual);
  }
  local_20 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560);
  if ((local_11 & 1) == 0) {
    local_28 = *(long *)(in_RDI + 8);
    local_30 = (int *)(in_RDI + 0x2198);
    local_38 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978);
    local_40 = 0.0;
    for (local_44 = 0; pvVar4 = local_20, local_44 < *(int *)(in_RDI + 0x219c);
        local_44 = local_44 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_44);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
      dVar8 = *pvVar3;
      pvVar4 = local_20 + 2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_44);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
      local_50 = dVar8 + *pvVar3;
      local_58 = ABS(local_50);
      pdVar5 = std::max<double>(&local_58,&local_40);
      local_40 = *pdVar5;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x783894);
    local_8c = *local_30 + local_30[1];
    local_98 = 0;
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28,(value_type_conflict1 *)0x7838d0);
    local_a8 = 0;
    local_ac = 0;
    local_b8 = 0.0;
    for (local_bc = 0; local_bc < local_8c; local_bc = local_bc + 1) {
      pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(local_38 + 1),
                          (long)local_bc);
      if (*pvVar6 != '\0') {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_bc);
        vVar9 = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_20 + 2,(long)local_bc);
        local_c8 = vVar9 + *pvVar3;
        local_d0 = ABS(local_c8);
        pdVar5 = std::max<double>(&local_d0,&local_b8);
        local_b8 = *pdVar5;
      }
    }
    local_e0 = (local_40 + local_b8) * 0.5 * 1e-16;
    local_e8 = 1e-16;
    pdVar5 = std::max<double>(&local_e0,&local_e8);
    local_d8 = *pdVar5;
    for (local_ec = 0; local_ec < local_8c; local_ec = local_ec + 1) {
      pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(local_38 + 1),
                          (long)local_ec);
      if (*pvVar6 == '\0') {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&debugComputeDual::previous_dual,(long)local_ec);
        *pvVar7 = 0.0;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_ec);
        *pvVar7 = 0.0;
      }
      else {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_70,(long)local_ec);
        dVar8 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&debugComputeDual::previous_dual,(long)local_ec);
        dVar8 = dVar8 - *pvVar7;
        local_f8 = dVar8;
        if (local_d8 <= ABS(dVar8)) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_88,(long)local_ec);
          *pvVar7 = dVar8;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&debugComputeDual::previous_dual,(long)local_ec);
          local_199 = false;
          if (*(double *)(local_28 + 0x120) <= ABS(*pvVar7) &&
              ABS(*pvVar7) != *(double *)(local_28 + 0x120)) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&local_70,(long)local_ec);
            local_199 = false;
            if (*(double *)(local_28 + 0x120) <= ABS(*pvVar7) &&
                ABS(*pvVar7) != *(double *)(local_28 + 0x120)) {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&debugComputeDual::previous_dual,(long)local_ec);
              dVar8 = *pvVar7;
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&local_70,(long)local_ec);
              local_199 = dVar8 * *pvVar7 < 0.0;
            }
          }
          local_f9 = local_199;
          if (local_199 != false) {
            local_a8 = local_a8 + 1;
          }
          local_ac = local_ac + 1;
        }
      }
    }
    if (local_ac != 0) {
      printf("\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = %d\n",
             (ulong)*(uint *)(in_RDI + 0x36f8),(ulong)local_a8);
      printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n",local_40,local_b8,local_d8);
      in_stack_fffffffffffffe40 = (vector<double,_std::allocator<double>_> *)(local_28 + 0x380);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,"Delta duals",&local_121);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Unknown",&local_149);
      analyseVectorValues(in_stack_00000250,in_stack_00000248,in_stack_00000244,in_stack_00000238,
                          (bool)in_stack_00000237,in_stack_00000228);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
    }
    local_4 = kOk;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe40);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe40);
  }
  else {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsDebugStatus HEkk::debugComputeDual(const bool initialise) const {
  static vector<double> previous_dual;
  const HighsSimplexInfo& info = this->info_;
  if (initialise) {
    previous_dual = info.workDual_;
    return HighsDebugStatus::kOk;
  }
  const HighsOptions& options = *(this->options_);
  //  if (options.highs_debug_level < kHighsDebugLevelCheap) return
  //  HighsDebugStatus::kNotChecked;
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;

  double norm_basic_costs = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    const double value = info.workCost_[basis.basicIndex_[iRow]] +
                         info.workShift_[basis.basicIndex_[iRow]];
    norm_basic_costs = max(fabs(value), norm_basic_costs);
  }

  vector<double> new_dual = info.workDual_;
  vector<double> delta_dual;
  HighsInt num_tot = lp.num_col_ + lp.num_row_;
  delta_dual.assign(num_tot, 0);
  HighsInt num_dual_sign_change = 0;
  HighsInt num_delta_dual_values = 0;
  double norm_nonbasic_costs = 0;
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) continue;
    double value = info.workCost_[iVar] + info.workShift_[iVar];
    norm_nonbasic_costs = max(fabs(value), norm_nonbasic_costs);
  }

  const double zero_delta_dual =
      max(0.5 * (norm_basic_costs + norm_nonbasic_costs) * 1e-16, 1e-16);
  for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
    if (!basis.nonbasicFlag_[iVar]) {
      previous_dual[iVar] = 0;
      new_dual[iVar] = 0;
      continue;
    }
    double delta = new_dual[iVar] - previous_dual[iVar];
    if (fabs(delta) < zero_delta_dual) continue;
    delta_dual[iVar] = delta;
    const bool sign_change =
        fabs(previous_dual[iVar]) > options.dual_feasibility_tolerance &&
        fabs(new_dual[iVar]) > options.dual_feasibility_tolerance &&
        previous_dual[iVar] * new_dual[iVar] < 0;
    if (sign_change) num_dual_sign_change++;
    num_delta_dual_values++;
  }
  if (num_delta_dual_values) {
    printf(
        "\nHEkk::debugComputeDual Iteration %d: Number of dual sign changes = "
        "%d\n",
        (int)iteration_count_, (int)num_dual_sign_change);
    printf("   |cB| = %g; |cN| = %g; zero delta dual = %g\n", norm_basic_costs,
           norm_nonbasic_costs, zero_delta_dual);
    //    analyseVectorValues(&options.log_options, "Previous duals", num_tot,
    //    previous_dual); analyseVectorValues(&options.log_options, "New duals",
    //    num_tot, new_dual);
    analyseVectorValues(&options.log_options, "Delta duals", num_tot,
                        delta_dual);
  }
  return HighsDebugStatus::kOk;
}